

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

EraseResult __thiscall
QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
::erase(QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
        *this,const_iterator first,const_iterator last)

{
  EraseResult EVar1;
  bool bVar2;
  QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
  *pQVar3;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator i;
  iterator newDataEnd;
  EraseResult result;
  value_type *in_stack_ffffffffffffff58;
  QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
  *in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff78;
  _Rb_tree_const_iterator<std::pair<const_int,_ProString>_> local_60;
  _Rb_tree_const_iterator<std::pair<const_int,_ProString>_> local_58;
  _Base_ptr local_50;
  _Self local_48;
  _Self local_40;
  iterator local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20;
  QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
  *local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
              *)0xaaaaaaaaaaaaaaaa;
  local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  EraseResult::EraseResult((EraseResult *)0x2e53b6);
  pQVar3 = (QMapData<std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>_>
            *)operator_new(0x38);
  QMapData(in_stack_ffffffffffffff60);
  local_18 = pQVar3;
  local_38._M_node =
       (_Base_ptr)
       std::
       multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>::
       end((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
            *)in_stack_ffffffffffffff58);
  local_40._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_30 = local_38._M_node;
  local_10._M_node = local_38._M_node;
  local_40._M_node =
       (_Base_ptr)
       std::
       multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>::
       begin((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
              *)in_stack_ffffffffffffff58);
  local_48._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_48._M_node =
       (_Base_ptr)
       std::
       multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>::
       end((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
            *)in_stack_ffffffffffffff58);
  while (bVar2 = std::operator!=(&local_40,&local_20), bVar2) {
    in_stack_ffffffffffffff78._M_node = (_Base_ptr)&local_18->m;
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::_Rb_tree_const_iterator
              (&local_58,&local_38);
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_int,_ProString>_> *)0x2e5496);
    local_50 = (_Base_ptr)
               std::
               multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
               ::insert((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
                         *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff58);
    local_10._M_node = local_50;
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_ProString>_> *)
               in_stack_ffffffffffffff60);
  }
  while (bVar2 = std::operator!=(&local_40,&local_28), bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_ProString>_> *)
               in_stack_ffffffffffffff60);
  }
  while (bVar2 = std::operator!=(&local_40,&local_48), bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::_Rb_tree_const_iterator
              (&local_60,&local_38);
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_int,_ProString>_> *)0x2e552d);
    std::multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
    ::insert((multimap<int,_ProString,_std::less<int>,_std::allocator<std::pair<const_int,_ProString>_>_>
              *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff78,in_stack_ffffffffffffff58);
    std::_Rb_tree_const_iterator<std::pair<const_int,_ProString>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_ProString>_> *)
               in_stack_ffffffffffffff60);
  }
  bVar2 = std::operator!=(&local_10,&local_38);
  if (bVar2) {
    std::_Rb_tree_iterator<std::pair<const_int,_ProString>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_ProString>_> *)in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  EVar1.it._M_node = local_10._M_node;
  EVar1.data = local_18;
  return EVar1;
}

Assistant:

EraseResult erase(const_iterator first, const_iterator last) const
    {
        EraseResult result;
        result.data = new QMapData;
        result.it = result.data->m.end();
        const auto newDataEnd = result.it;

        auto i = m.begin();
        const auto e = m.end();

        // copy over all the elements before first
        while (i != first) {
            result.it = result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        // skip until last
        while (i != last)
            ++i;

        // copy from last to the end
        while (i != e) {
            result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        if (result.it != newDataEnd)
            ++result.it;

        return result;
    }